

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfs.c
# Opt level: O3

lws_plat_file_ops * lws_vfs_select_fops(lws_plat_file_ops *fops,char *vfs_path,char **vpath)

{
  lws_plat_file_ops *plVar1;
  char *__s2;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  lws_plat_file_ops *plVar6;
  
  *vpath = (char *)0x0;
  plVar1 = fops->next;
  pcVar5 = vfs_path;
  if (vfs_path == (char *)0x0 || plVar1 == (lws_plat_file_ops *)0x0) {
    return fops;
  }
  do {
    plVar6 = plVar1;
    if (*pcVar5 == '/') {
      do {
        lVar4 = 0x30;
        do {
          __s2 = *(char **)((long)(plVar6->fi + -3) + lVar4);
          if (__s2 == (char *)0x0) break;
          uVar3 = (ulong)*(byte *)((long)plVar6->fi + lVar4 + -0x28);
          if ((vfs_path + uVar3 <= pcVar5) &&
             (iVar2 = strncmp(pcVar5 + (1 - uVar3),__s2,uVar3 - 1), iVar2 == 0)) {
            *vpath = pcVar5 + 1;
            return plVar6;
          }
          lVar4 = lVar4 + 0x10;
        } while (lVar4 != 0x60);
        plVar6 = plVar6->next;
      } while (plVar6 != (lws_plat_file_ops *)0x0);
    }
    else if (*pcVar5 == '\0') {
      return fops;
    }
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

const struct lws_plat_file_ops *
lws_vfs_select_fops(const struct lws_plat_file_ops *fops, const char *vfs_path,
		    const char **vpath)
{
	const struct lws_plat_file_ops *pf;
	const char *p = vfs_path;
	int n;

	*vpath = NULL;

	/* no non-platform fops, just use that */

	if (!fops->next)
		return fops;

	/*
	 *  scan the vfs path looking for indications we are to be
	 * handled by a specific fops
	 */

	while (p && *p) {
		if (*p != '/') {
			p++;
			continue;
		}
		/* the first one is always platform fops, so skip */
		pf = fops->next;
		while (pf) {
			n = 0;
			while (n < (int)LWS_ARRAY_SIZE(pf->fi) && pf->fi[n].sig) {
				if (p >= vfs_path + pf->fi[n].len)
					if (!strncmp(p - (pf->fi[n].len - 1),
						     pf->fi[n].sig,
						     pf->fi[n].len - 1)) {
						*vpath = p + 1;
						return pf;
					}

				n++;
			}
			pf = pf->next;
		}
		p++;
	}

	return fops;
}